

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::addMsgField(DataDictionary *this,string *msgType,int field)

{
  mapped_type *this_00;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  int local_1c;
  
  local_1c = field;
  if (this->m_storeMsgFieldsOrder == true) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
              ::operator[](&this->m_messageOrderedFields,msgType);
    MessageFieldsOrderHolder::push_back(this_00,field);
  }
  this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_messageFields,msgType);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>(this_01,&local_1c);
  return;
}

Assistant:

void addMsgField( const std::string& msgType, int field )
  {
    if (m_storeMsgFieldsOrder)
    {
      m_messageOrderedFields[ msgType ].push_back(field);
    }

    m_messageFields[ msgType ].insert( field );
  }